

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

DynamicStackArray<embree::Vec3fa,_32UL,_128UL> * __thiscall
embree::DynamicStackArray<embree::Vec3fa,_32UL,_128UL>::operator=
          (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *this,
          DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar3;
  undefined8 uVar4;
  ulong uVar5;
  DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *pDVar6;
  Vec3fa *pVVar7;
  long lVar8;
  ulong uVar9;
  
  uVar9 = 0;
  while( true ) {
    pDVar3 = (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)other->data;
    uVar5 = 0x80;
    if (pDVar3 == other) {
      uVar5 = 0x20;
    }
    if (uVar5 <= uVar9) break;
    pDVar6 = (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)this->data;
    if ((0x1f < uVar9) && (pDVar6 == this)) {
      pVVar7 = (Vec3fa *)Vec3fa::operator_new__(0x800);
      this->data = pVVar7;
      for (lVar8 = 0; lVar8 != 0x200; lVar8 = lVar8 + 0x10) {
        puVar1 = (undefined8 *)((long)&this->arr[0].field_0 + lVar8);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)&this->data->field_0 + lVar8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
      }
      pDVar6 = (DynamicStackArray<embree::Vec3fa,_32UL,_128UL> *)this->data;
    }
    pVVar7 = pDVar3->arr + uVar9;
    uVar4 = *(undefined8 *)((long)&pVVar7->field_0 + 8);
    *(undefined8 *)&pDVar6->arr[uVar9].field_0 = *(undefined8 *)&pVVar7->field_0;
    *(undefined8 *)((long)&pDVar6->arr[uVar9].field_0 + 8) = uVar4;
    uVar9 = uVar9 + 1;
  }
  return this;
}

Assistant:

DynamicStackArray& operator= (const DynamicStackArray& other)
    {
      for (size_t i=0; i<other.size(); i++)
        this->operator[] (i) = other[i];

      return *this;
    }